

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O1

void __thiscall despot::POMDPX::PrintModel(POMDPX *this,ostream *out)

{
  ostream *poVar1;
  vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_> local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Parser pointer = ",0x11);
  poVar1 = std::ostream::_M_insert<void_const*>(out);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"is_small = ",0xb);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(out,0));
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Min reward action = ",0x14);
  poVar1 = despot::operator<<(out,&this->min_reward_action_);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Max reward action = ",0x14);
  poVar1 = despot::operator<<(out,&this->max_reward_action_);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"States = ",9);
  std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::vector
            (&local_60,&this->states_);
  poVar1 = despot::operator<<(out,&local_60);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_60.super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"Transitions = ",0xe);
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::vector(&local_30,&this->transition_probabilities_);
  poVar1 = despot::operator<<(out,&local_30);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::~vector(&local_30);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Rewards = ",10);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_48,&this->rewards_);
  poVar1 = despot::operator<<(out,&local_48);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(out,"MemoryPool = ",0xd);
  poVar1 = std::ostream::_M_insert<void_const*>(out);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void POMDPX::PrintModel(ostream& out) const {
	out << "Parser pointer = " << parser_ << endl;
	out << "is_small = " << is_small_ << endl;

	out << "Min reward action = " << min_reward_action_ << endl;
	out << "Max reward action = " << max_reward_action_ << endl;

	out << "States = " << states_ << endl;
	out << "Transitions = " << transition_probabilities_ << endl;
	out << "Rewards = " << rewards_ << endl;
	out << "MemoryPool = " << &memory_pool_ << endl;
}